

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O1

bool __thiscall Query::operator==(Query *this,Query *other)

{
  QToken *pQVar1;
  Query *pQVar2;
  bool bVar3;
  QToken *other_00;
  Query *other_01;
  QToken *this_00;
  Query *this_01;
  bool bVar4;
  
  if (this->type == other->type) {
    this_00 = (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
              super__Vector_impl_data._M_start;
    pQVar1 = (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
             super__Vector_impl_data._M_finish;
    other_00 = (other->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((long)pQVar1 - (long)this_00 ==
        (long)(other->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)other_00) {
      bVar4 = this_00 == pQVar1;
      if (bVar4) {
LAB_00149939:
        if (bVar4) {
          this_01 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pQVar2 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          other_01 = (other->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if ((long)pQVar2 - (long)this_01 ==
              (long)(other->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)other_01) {
            bVar4 = this_01 == pQVar2;
            if (bVar4) {
              return bVar4;
            }
            bVar3 = operator==(this_01,other_01);
            if (!bVar3) {
              return bVar4;
            }
            do {
              this_01 = this_01 + 1;
              other_01 = other_01 + 1;
              bVar4 = this_01 == pQVar2;
              if (bVar4) {
                return bVar4;
              }
              bVar3 = operator==(this_01,other_01);
            } while (bVar3);
            return bVar4;
          }
        }
      }
      else {
        bVar4 = QToken::operator==(this_00,other_00);
        if (bVar4) {
          do {
            this_00 = this_00 + 1;
            other_00 = other_00 + 1;
            bVar4 = this_00 == pQVar1;
            if (bVar4) goto LAB_00149939;
            bVar4 = QToken::operator==(this_00,other_00);
          } while (bVar4);
        }
      }
    }
  }
  return false;
}

Assistant:

bool Query::operator==(const Query &other) const {
    return type == other.type && value == other.value &&
           queries == other.queries;
}